

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O2

int NV21ToYUV24(uint8_t *src_y,int src_stride_y,uint8_t *src_vu,int src_stride_vu,uint8_t *dst_yuv24
               ,int dst_stride_yuv24,int width,int height)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  if (height == 0 ||
      (width < 1 ||
      (dst_yuv24 == (uint8_t *)0x0 || (src_vu == (uint8_t *)0x0 || src_y == (uint8_t *)0x0)))) {
    iVar2 = -1;
  }
  else {
    uVar1 = height;
    if (height < 0) {
      uVar1 = -height;
      dst_yuv24 = dst_yuv24 + ~height * dst_stride_yuv24;
      dst_stride_yuv24 = -dst_stride_yuv24;
    }
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      NV21ToYUV24Row_C(src_y,src_vu,dst_yuv24,width);
      dst_yuv24 = dst_yuv24 + dst_stride_yuv24;
      src_y = src_y + src_stride_y;
      src_vu = src_vu + (int)(-(uVar3 & 1) & src_stride_vu);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int NV21ToYUV24(const uint8_t* src_y,
                int src_stride_y,
                const uint8_t* src_vu,
                int src_stride_vu,
                uint8_t* dst_yuv24,
                int dst_stride_yuv24,
                int width,
                int height) {
  int y;
  void (*NV21ToYUV24Row)(const uint8_t* src_y, const uint8_t* src_vu,
                         uint8_t* dst_yuv24, int width) = NV21ToYUV24Row_C;
  if (!src_y || !src_vu || !dst_yuv24 || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_yuv24 = dst_yuv24 + (height - 1) * dst_stride_yuv24;
    dst_stride_yuv24 = -dst_stride_yuv24;
  }
#if defined(HAS_NV21TOYUV24ROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    NV21ToYUV24Row = NV21ToYUV24Row_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      NV21ToYUV24Row = NV21ToYUV24Row_NEON;
    }
  }
#endif
#if defined(HAS_NV21TOYUV24ROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    NV21ToYUV24Row = NV21ToYUV24Row_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      NV21ToYUV24Row = NV21ToYUV24Row_AVX2;
    }
  }
#endif
  for (y = 0; y < height; ++y) {
    NV21ToYUV24Row(src_y, src_vu, dst_yuv24, width);
    dst_yuv24 += dst_stride_yuv24;
    src_y += src_stride_y;
    if (y & 1) {
      src_vu += src_stride_vu;
    }
  }
  return 0;
}